

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  undefined8 uVar9;
  long lVar10;
  bench_data data;
  secp256k1_ecdsa_signature sig;
  secp256k1_pubkey pubkey;
  int in_stack_fffffffffffffe68;
  char **local_190;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined1 local_130 [72];
  undefined8 local_e8;
  undefined1 local_e0 [40];
  undefined8 local_b8;
  undefined1 local_b0 [64];
  undefined1 local_70 [64];
  
  pcVar4 = getenv("SECP256K1_BENCH_ITERS");
  if (pcVar4 == (char *)0x0) {
    uVar5 = 20000;
  }
  else {
    uVar5 = strtol(pcVar4,(char **)0x0,0);
  }
  lVar10 = (long)argc;
  if (argc != 1) {
    local_190 = argv + 1;
    do {
      pcVar4 = *local_190;
      lVar7 = 0;
      while( true ) {
        pcVar8 = pcVar4;
        iVar1 = strcmp(pcVar4,*(char **)((long)&PTR_anon_var_dwarf_d5_00108d20 + lVar7));
        iVar3 = (int)pcVar8;
        if (iVar1 == 0) break;
        lVar7 = lVar7 + 8;
        if (lVar7 == 0xa8) goto LAB_0010305e;
      }
      local_190 = local_190 + 1;
    } while (local_190 != argv + lVar10);
LAB_0010305e:
    if (1 < argc) {
      lVar7 = lVar10 * 8;
      lVar6 = 8;
      do {
        pcVar4 = *(char **)((long)argv + lVar6);
        if (((*pcVar4 == '-') && (pcVar4[1] == 'h')) && (pcVar4[2] == '\0')) goto LAB_001030e7;
        lVar6 = lVar6 + 8;
      } while (lVar7 - lVar6 != 0);
      lVar6 = 8;
      do {
        if (lVar7 - lVar6 == 0) {
          lVar6 = 8;
          goto LAB_001030ce;
        }
        pcVar4 = *(char **)((long)argv + lVar6);
        iVar2 = strcmp(pcVar4,"--help");
        iVar3 = (int)pcVar4;
        lVar6 = lVar6 + 8;
      } while (iVar2 != 0);
      goto LAB_001030e7;
    }
  }
LAB_00103103:
  lVar10 = lVar10 * 8;
  lVar7 = 8;
  do {
    if (lVar10 == lVar7) {
      lVar7 = 8;
      goto LAB_0010313c;
    }
    iVar1 = strcmp(*(char **)((long)argv + lVar7),"recover");
    lVar7 = lVar7 + 8;
  } while (iVar1 != 0);
  goto LAB_00103155;
  while( true ) {
    iVar3 = strcmp(*(char **)((long)argv + lVar7),"ecdsa");
    lVar7 = lVar7 + 8;
    if (iVar3 == 0) break;
LAB_00103297:
    if (lVar10 == lVar7) {
      lVar7 = 8;
      goto LAB_001032bf;
    }
  }
  goto LAB_00103300;
  while( true ) {
    iVar3 = strcmp(*(char **)((long)argv + lVar7),"verify");
    lVar7 = lVar7 + 8;
    if (iVar3 == 0) break;
LAB_001032bf:
    if (lVar10 == lVar7) {
      lVar7 = 8;
      goto LAB_001032e7;
    }
  }
  goto LAB_00103300;
  while( true ) {
    iVar3 = strcmp(*(char **)((long)argv + lVar7),"sign");
    lVar7 = lVar7 + 8;
    if (iVar3 == 0) break;
LAB_00103357:
    if (lVar10 == lVar7) {
      lVar7 = 8;
      goto LAB_0010337f;
    }
  }
  goto LAB_00103398;
  while( true ) {
    iVar3 = strcmp(*(char **)((long)argv + lVar7),"ecdsa_sign");
    lVar7 = lVar7 + 8;
    if (iVar3 == 0) break;
LAB_0010337f:
    if (lVar10 == lVar7) goto LAB_001033ba;
  }
  goto LAB_00103398;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar7),"ec_keygen");
    iVar3 = (int)uVar9;
    lVar7 = lVar7 + 8;
    if (iVar2 == 0) break;
LAB_00103417:
    if (lVar10 == lVar7) goto LAB_00103458;
  }
  goto LAB_00103430;
  while( true ) {
    pcVar4 = *(char **)((long)argv + lVar6);
    iVar2 = strcmp(pcVar4,"help");
    iVar3 = (int)pcVar4;
    lVar6 = lVar6 + 8;
    if (iVar2 == 0) break;
LAB_001030ce:
    if (lVar7 - lVar6 == 0) {
      if (iVar1 != 0) {
        main_cold_1();
        return 1;
      }
      goto LAB_00103103;
    }
  }
LAB_001030e7:
  help(iVar3);
  return 0;
  while( true ) {
    iVar1 = strcmp(*(char **)((long)argv + lVar7),"ecdsa_recover");
    lVar7 = lVar7 + 8;
    if (iVar1 == 0) break;
LAB_0010313c:
    if (lVar10 == lVar7) {
      local_178 = secp256k1_context_create(1);
      local_170 = 0x807060504030201;
      uStack_168 = 0x100f0e0d0c0b0a09;
      local_160 = 0x1817161514131211;
      uStack_158 = 0x201f1e1d1c1b1a19;
      local_150 = 0x2827262524232221;
      uStack_148 = 0x302f2e2d2c2b2a29;
      local_140 = 0x34333231;
      uStack_13c = 0x38373635;
      uStack_138 = 0x3c3b3a39;
      uStack_134 = 0x403f3e3d;
      local_e8 = 0x48;
      uVar9 = 0;
      iVar1 = secp256k1_ecdsa_sign(local_178,local_b0,&local_170,&local_150,0);
      if (iVar1 == 0) {
        main_cold_6();
LAB_001034ae:
        main_cold_5();
      }
      else {
        iVar1 = secp256k1_ecdsa_signature_serialize_der(local_178,local_130,&local_e8,local_b0);
        if (iVar1 == 0) goto LAB_001034ae;
        iVar1 = secp256k1_ec_pubkey_create(local_178,local_70,&local_150);
        if (iVar1 != 0) {
          local_b8 = 0x21;
          iVar1 = secp256k1_ec_pubkey_serialize(local_178,local_e0,&local_b8,local_70,0x102);
          if (iVar1 != 1) goto LAB_001034b8;
          printf("%-30s,%-15s,%-15s,%-15s\n","Benchmark","    Min(us)    ","    Avg(us)    ",
                 "    Max(us)    ");
          putchar(10);
          iVar1 = (int)uVar5;
          if (argc == 1) goto LAB_00103300;
          lVar7 = 8;
          goto LAB_00103297;
        }
      }
      main_cold_4();
LAB_001034b8:
      main_cold_3();
      puts("Benchmarks the following algorithms:");
      puts("    - ECDSA signing/verification");
      puts("    - ECDH key exchange (optional module)");
      puts("    - Schnorr signatures (optional module)");
      puts("    - ElligatorSwift (optional module)");
      putchar(10);
      printf("The default number of iterations for each benchmark is %d. This can be\n",20000);
      puts("customized using the SECP256K1_BENCH_ITERS environment variable.");
      putchar(10);
      puts("Usage: ./bench [args]");
      puts("By default, all benchmarks will be run.");
      puts("args:");
      puts("    help              : display this help and exit");
      puts("    ecdsa             : all ECDSA algorithms--sign, verify, recovery (if enabled)");
      puts("    ecdsa_sign        : ECDSA siging algorithm");
      puts("    ecdsa_verify      : ECDSA verification algorithm");
      puts("    ec                : all EC public key algorithms (keygen)");
      puts("    ec_keygen         : EC public key generation");
      puts("    ecdh              : ECDH key exchange algorithm");
      puts("    schnorrsig        : all Schnorr signature algorithms (sign, verify)");
      puts("    schnorrsig_sign   : Schnorr sigining algorithm");
      puts("    schnorrsig_verify : Schnorr verification algorithm");
      puts("    ellswift          : all ElligatorSwift benchmarks (encode, decode, keygen, ecdh)");
      puts("    ellswift_encode   : ElligatorSwift encoding");
      puts("    ellswift_decode   : ElligatorSwift decoding");
      puts("    ellswift_keygen   : ElligatorSwift key generation");
      puts("    ellswift_ecdh     : ECDH on ElligatorSwift keys");
      iVar1 = putchar(10);
      return iVar1;
    }
  }
LAB_00103155:
  main_cold_2();
  return 1;
  while( true ) {
    iVar3 = strcmp(*(char **)((long)argv + lVar7),"ecdsa_verify");
    lVar7 = lVar7 + 8;
    if (iVar3 == 0) break;
LAB_001032e7:
    if (lVar10 == lVar7) goto LAB_0010331d;
  }
LAB_00103300:
  run_benchmark("ecdsa_verify",bench_verify,(_func_void_void_ptr *)0x0,
                (_func_void_void_ptr_int *)&local_178,(void *)(uVar5 & 0xffffffff),(int)uVar9,
                in_stack_fffffffffffffe68);
LAB_0010331d:
  if (argc != 1) {
    lVar7 = 8;
    do {
      if (lVar10 == lVar7) {
        lVar7 = 8;
        goto LAB_00103357;
      }
      iVar3 = strcmp(*(char **)((long)argv + lVar7),"ecdsa");
      lVar7 = lVar7 + 8;
    } while (iVar3 != 0);
  }
LAB_00103398:
  run_benchmark("ecdsa_sign",bench_sign_run,bench_sign_setup,(_func_void_void_ptr_int *)&local_178,
                (void *)(uVar5 & 0xffffffff),(int)uVar9,in_stack_fffffffffffffe68);
LAB_001033ba:
  iVar3 = (int)uVar9;
  if (argc != 1) {
    lVar7 = 8;
    do {
      pcVar4 = *(char **)((long)argv + lVar7);
      if (((*pcVar4 == 'e') && (pcVar4[1] == 'c')) && (pcVar4[2] == '\0')) goto LAB_00103430;
      lVar7 = lVar7 + 8;
    } while (lVar10 != lVar7);
    lVar7 = 8;
    do {
      if (lVar10 == lVar7) {
        lVar7 = 8;
        goto LAB_00103417;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar7),"keygen");
      iVar3 = (int)uVar9;
      lVar7 = lVar7 + 8;
    } while (iVar2 != 0);
  }
LAB_00103430:
  run_benchmark("ec_keygen",bench_keygen_run,bench_keygen_setup,
                (_func_void_void_ptr_int *)&local_178,(void *)(uVar5 & 0xffffffff),iVar3,
                in_stack_fffffffffffffe68);
LAB_00103458:
  secp256k1_context_destroy(local_178);
  run_ecdh_bench(iVar1,argc,argv);
  run_schnorrsig_bench(iVar1,argc,argv);
  run_ellswift_bench(iVar1,argc,argv);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    int i;
    secp256k1_pubkey pubkey;
    secp256k1_ecdsa_signature sig;
    bench_data data;

    int d = argc == 1;
    int default_iters = 20000;
    int iters = get_iters(default_iters);

    /* Check for invalid user arguments */
    char* valid_args[] = {"ecdsa", "verify", "ecdsa_verify", "sign", "ecdsa_sign", "ecdh", "recover",
                         "ecdsa_recover", "schnorrsig", "schnorrsig_verify", "schnorrsig_sign", "ec",
                         "keygen", "ec_keygen", "ellswift", "encode", "ellswift_encode", "decode",
                         "ellswift_decode", "ellswift_keygen", "ellswift_ecdh"};
    size_t valid_args_size = sizeof(valid_args)/sizeof(valid_args[0]);
    int invalid_args = have_invalid_args(argc, argv, valid_args, valid_args_size);

    if (argc > 1) {
        if (have_flag(argc, argv, "-h")
           || have_flag(argc, argv, "--help")
           || have_flag(argc, argv, "help")) {
            help(default_iters);
            return EXIT_SUCCESS;
        } else if (invalid_args) {
            fprintf(stderr, "./bench: unrecognized argument.\n\n");
            help(default_iters);
            return EXIT_FAILURE;
        }
    }

/* Check if the user tries to benchmark optional module without building it */
#ifndef ENABLE_MODULE_ECDH
    if (have_flag(argc, argv, "ecdh")) {
        fprintf(stderr, "./bench: ECDH module not enabled.\n");
        fprintf(stderr, "Use ./configure --enable-module-ecdh.\n\n");
        return EXIT_FAILURE;
    }
#endif

#ifndef ENABLE_MODULE_RECOVERY
    if (have_flag(argc, argv, "recover") || have_flag(argc, argv, "ecdsa_recover")) {
        fprintf(stderr, "./bench: Public key recovery module not enabled.\n");
        fprintf(stderr, "Use ./configure --enable-module-recovery.\n\n");
        return EXIT_FAILURE;
    }
#endif

#ifndef ENABLE_MODULE_SCHNORRSIG
    if (have_flag(argc, argv, "schnorrsig") || have_flag(argc, argv, "schnorrsig_sign") || have_flag(argc, argv, "schnorrsig_verify")) {
        fprintf(stderr, "./bench: Schnorr signatures module not enabled.\n");
        fprintf(stderr, "Use ./configure --enable-module-schnorrsig.\n\n");
        return EXIT_FAILURE;
    }
#endif

#ifndef ENABLE_MODULE_ELLSWIFT
    if (have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "ellswift_encode") || have_flag(argc, argv, "ellswift_decode") ||
        have_flag(argc, argv, "encode") || have_flag(argc, argv, "decode") || have_flag(argc, argv, "ellswift_keygen") ||
        have_flag(argc, argv, "ellswift_ecdh")) {
        fprintf(stderr, "./bench: ElligatorSwift module not enabled.\n");
        fprintf(stderr, "Use ./configure --enable-module-ellswift.\n\n");
        return EXIT_FAILURE;
    }
#endif

    /* ECDSA benchmark */
    data.ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);

    for (i = 0; i < 32; i++) {
        data.msg[i] = 1 + i;
    }
    for (i = 0; i < 32; i++) {
        data.key[i] = 33 + i;
    }
    data.siglen = 72;
    CHECK(secp256k1_ecdsa_sign(data.ctx, &sig, data.msg, data.key, NULL, NULL));
    CHECK(secp256k1_ecdsa_signature_serialize_der(data.ctx, data.sig, &data.siglen, &sig));
    CHECK(secp256k1_ec_pubkey_create(data.ctx, &pubkey, data.key));
    data.pubkeylen = 33;
    CHECK(secp256k1_ec_pubkey_serialize(data.ctx, data.pubkey, &data.pubkeylen, &pubkey, SECP256K1_EC_COMPRESSED) == 1);

    print_output_table_header_row();
    if (d || have_flag(argc, argv, "ecdsa") || have_flag(argc, argv, "verify") || have_flag(argc, argv, "ecdsa_verify")) run_benchmark("ecdsa_verify", bench_verify, NULL, NULL, &data, 10, iters);

    if (d || have_flag(argc, argv, "ecdsa") || have_flag(argc, argv, "sign") || have_flag(argc, argv, "ecdsa_sign")) run_benchmark("ecdsa_sign", bench_sign_run, bench_sign_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "ec") || have_flag(argc, argv, "keygen") || have_flag(argc, argv, "ec_keygen")) run_benchmark("ec_keygen", bench_keygen_run, bench_keygen_setup, NULL, &data, 10, iters);

    secp256k1_context_destroy(data.ctx);

#ifdef ENABLE_MODULE_ECDH
    /* ECDH benchmarks */
    run_ecdh_bench(iters, argc, argv);
#endif

#ifdef ENABLE_MODULE_RECOVERY
    /* ECDSA recovery benchmarks */
    run_recovery_bench(iters, argc, argv);
#endif

#ifdef ENABLE_MODULE_SCHNORRSIG
    /* Schnorr signature benchmarks */
    run_schnorrsig_bench(iters, argc, argv);
#endif

#ifdef ENABLE_MODULE_ELLSWIFT
    /* ElligatorSwift benchmarks */
    run_ellswift_bench(iters, argc, argv);
#endif

    return EXIT_SUCCESS;
}